

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O0

void __thiscall bsplib::Rdma::ActionBuf::clear(ActionBuf *this)

{
  int local_3c;
  unsigned_long *local_38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  int local_24;
  unsigned_long *local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_18;
  ActionBuf *local_10;
  ActionBuf *this_local;
  
  this->m_dummy_bsmp = 0;
  local_10 = this;
  std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::clear(&this->m_actions);
  local_18._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_counts);
  local_20 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_counts);
  local_24 = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_18,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_20,&local_24);
  local_30._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_get_buffer_offset)
  ;
  local_38 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (&this->m_get_buffer_offset);
  local_3c = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_30,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_38,&local_3c);
  return;
}

Assistant:

void clear() 
        {
            m_dummy_bsmp = false;
            m_actions.clear();
            std::fill( m_counts.begin(), m_counts.end(), 0);
            std::fill( m_get_buffer_offset.begin(), m_get_buffer_offset.end(), 0);
        }